

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlHashedString xmlParseNCName(xmlParserCtxtPtr ctxt)

{
  byte *pbVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  xmlHashedString xVar5;
  size_t maxLength;
  size_t count;
  xmlHashedString ret;
  xmlChar *e;
  xmlChar *in;
  xmlParserCtxtPtr ctxt_local;
  xmlChar *local_10;
  
  iVar3 = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar3 = 10000000;
  }
  e = ctxt->input->cur;
  pbVar1 = ctxt->input->end;
  if (((((0x60 < *e) && (*e < 0x7b)) || ((0x40 < *e && (*e < 0x5b)))) || (*e == 0x5f)) &&
     (e < pbVar1)) {
    do {
      e = e + 1;
      if ((((0x60 < *e) && (*e < 0x7b)) || ((0x40 < *e && (*e < 0x5b)))) ||
         ((((0x2f < *e && (*e < 0x3a)) || (*e == '_')) ||
          ((*e == '-' || (bVar4 = false, *e == '.')))))) {
        bVar4 = e < pbVar1;
      }
    } while (bVar4);
    if (((e < pbVar1) && (*e != '\0')) && (*e < 0x80)) {
      uVar2 = (long)e - (long)ctxt->input->cur;
      if ((ulong)(long)iVar3 < uVar2) {
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
        ctxt_local = (xmlParserCtxtPtr)count;
        local_10 = (xmlChar *)0x0;
      }
      else {
        iVar3 = (int)uVar2;
        xVar5 = xmlDictLookupHashed(ctxt->dict,ctxt->input->cur,iVar3);
        local_10 = xVar5.name;
        ctxt_local = (xmlParserCtxtPtr)(ulong)xVar5.hashValue;
        ctxt->input->cur = e;
        ctxt->input->col = ctxt->input->col + iVar3;
        if (local_10 == (xmlChar *)0x0) {
          xmlErrMemory(ctxt);
        }
      }
      goto LAB_00156156;
    }
  }
  xVar5 = xmlParseNCNameComplex(ctxt);
  local_10 = xVar5.name;
  ctxt_local = (xmlParserCtxtPtr)(ulong)xVar5.hashValue;
LAB_00156156:
  xVar5._0_8_ = (ulong)ctxt_local & 0xffffffff;
  xVar5.name = local_10;
  return xVar5;
}

Assistant:

static xmlHashedString
xmlParseNCName(xmlParserCtxtPtr ctxt) {
    const xmlChar *in, *e;
    xmlHashedString ret;
    size_t count = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_TEXT_LENGTH :
                       XML_MAX_NAME_LENGTH;

    ret.name = NULL;

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    e = ctxt->input->end;
    if ((((*in >= 0x61) && (*in <= 0x7A)) ||
	 ((*in >= 0x41) && (*in <= 0x5A)) ||
	 (*in == '_')) && (in < e)) {
	in++;
	while ((((*in >= 0x61) && (*in <= 0x7A)) ||
	        ((*in >= 0x41) && (*in <= 0x5A)) ||
	        ((*in >= 0x30) && (*in <= 0x39)) ||
	        (*in == '_') || (*in == '-') ||
	        (*in == '.')) && (in < e))
	    in++;
	if (in >= e)
	    goto complex;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
            if (count > maxLength) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
                return(ret);
            }
	    ret = xmlDictLookupHashed(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    if (ret.name == NULL) {
	        xmlErrMemory(ctxt);
	    }
	    return(ret);
	}
    }
complex:
    return(xmlParseNCNameComplex(ctxt));
}